

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

bool __thiscall QListModel::insertRows(QListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QListWidget *pQVar3;
  QListWidgetItem *this_00;
  ulong i;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    iVar2 = (**(code **)(*(long *)this + 0x78))();
    if (row <= iVar2) {
      bVar1 = QModelIndex::isValid(parent);
      if (!bVar1) {
        local_50 = 0xffffffffffffffff;
        local_48 = 0;
        uStack_40 = 0;
        QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,row);
        pQVar3 = view(this);
        for (i = (ulong)(uint)row; (int)i < count + row; i = i + 1) {
          this_00 = (QListWidgetItem *)operator_new(0x28);
          QListWidgetItem::QListWidgetItem(this_00,(QListWidget *)0x0,0);
          this_00->view = pQVar3;
          this_00->d->theid = (int)i;
          QList<QListWidgetItem_*>::insert(&this->items,i,this_00);
        }
        QAbstractItemModel::endInsertRows();
        bVar1 = true;
        goto LAB_0051fd86;
      }
    }
  }
  bVar1 = false;
LAB_0051fd86:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::insertRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || row > rowCount() || parent.isValid())
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);
    QListWidget *view = this->view();
    QListWidgetItem *itm = nullptr;

    for (int r = row; r < row + count; ++r) {
        itm = new QListWidgetItem;
        itm->view = view;
        itm->d->theid = r;
        items.insert(r, itm);
    }

    endInsertRows();
    return true;
}